

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O0

Gia_Man_t * Gia_ManReadGig(char *pFileName)

{
  int iVar1;
  abctime aVar2;
  FILE *__stream;
  abctime aVar3;
  Gls_Man_t *p_00;
  FILE *pFile;
  int pCounts [11];
  int i;
  Vec_Str_t *vLines;
  Gia_Man_t *pGia;
  Gls_Man_t *p;
  abctime clk;
  char *pFileName_local;
  
  aVar2 = Abc_Clock();
  vLines = (Vec_Str_t *)0x0;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot read file \"%s\".\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    register0x00000000 = Gls_ManCount((FILE *)__stream,(int *)&pFile);
    rewind(__stream);
    for (pCounts[9] = 0; pCounts[9] < 0xb; pCounts[9] = pCounts[9] + 1) {
      if (pCounts[(long)pCounts[9] + -2] != 0) {
        printf("%s=%d  ",s_Strs[pCounts[9]],(ulong)(uint)pCounts[(long)pCounts[9] + -2]);
      }
    }
    aVar3 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar3 - aVar2);
    p_00 = Gls_ManAlloc(stack0xffffffffffffffc8,(int *)&pFile);
    iVar1 = Gls_ManParse((FILE *)__stream,p_00);
    if (iVar1 != 0) {
      vLines = (Vec_Str_t *)Gls_ManConstruct(p_00,pFileName);
    }
    Gls_ManStop(p_00);
    fclose(__stream);
    pFileName_local = (char *)vLines;
  }
  return (Gia_Man_t *)pFileName_local;
}

Assistant:

Gia_Man_t * Gia_ManReadGig( char * pFileName )
{
    abctime clk = Abc_Clock();
    Gls_Man_t * p = NULL;
    Gia_Man_t * pGia = NULL;
    Vec_Str_t * vLines;
    int i, pCounts[GLS_FINAL];
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot read file \"%s\".\n", pFileName );
        return NULL;
    }
    vLines = Gls_ManCount( pFile, pCounts );
    rewind( pFile );
    // statistics
    for ( i = 0; i < GLS_FINAL; i++ )
        if ( pCounts[i] )
            printf( "%s=%d  ", s_Strs[i], pCounts[i] );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // collect data and derive AIG
    p = Gls_ManAlloc( vLines, pCounts );
    if ( Gls_ManParse( pFile, p ) )
        pGia = Gls_ManConstruct( p, pFileName );
    Gls_ManStop( p );
    fclose( pFile );
    //printf( "\n" );
    return pGia;
}